

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.cpp
# Opt level: O1

HalfedgeMesh * __thiscall CMU462::HalfedgeMesh::operator=(HalfedgeMesh *this,HalfedgeMesh *mesh)

{
  list<CMU462::Vertex,_std::allocator<CMU462::Vertex>_> *this_00;
  list<CMU462::Edge,_std::allocator<CMU462::Edge>_> *this_01;
  list<CMU462::Face,_std::allocator<CMU462::Face>_> *this_02;
  list<CMU462::Face,_std::allocator<CMU462::Face>_> *this_03;
  size_t *psVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  list<CMU462::Face,std::allocator<CMU462::Face>> *this_04;
  _List_node_base *p_Var5;
  mapped_type *pmVar6;
  _Node *p_Var7;
  mapped_type *pmVar8;
  _Node *p_Var9;
  mapped_type *pmVar10;
  _Node *p_Var11;
  mapped_type *pmVar12;
  list<CMU462::Vertex,std::allocator<CMU462::Vertex>> *plVar13;
  list<CMU462::Edge,std::allocator<CMU462::Edge>> *plVar14;
  list<CMU462::Face,std::allocator<CMU462::Face>> *plVar15;
  list<CMU462::Face,std::allocator<CMU462::Face>> *plVar16;
  HalfedgeMesh *pHVar17;
  map<std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::_List_const_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
  halfedgeOldToNew;
  map<std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>,_std::less<std::_List_const_iterator<CMU462::Face>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>_>_>_>
  faceOldToNew;
  map<std::_List_const_iterator<CMU462::Edge>,_std::_List_iterator<CMU462::Edge>,_std::less<std::_List_const_iterator<CMU462::Edge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Edge>,_std::_List_iterator<CMU462::Edge>_>_>_>
  edgeOldToNew;
  map<std::_List_const_iterator<CMU462::Vertex>,_std::_List_iterator<CMU462::Vertex>,_std::less<std::_List_const_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Vertex>,_std::_List_iterator<CMU462::Vertex>_>_>_>
  vertexOldToNew;
  key_type local_118;
  list<CMU462::Edge,std::allocator<CMU462::Edge>> *local_110;
  list<CMU462::Vertex,std::allocator<CMU462::Vertex>> *local_108;
  list<CMU462::Face,std::allocator<CMU462::Face>> *local_100;
  list<CMU462::Face,std::allocator<CMU462::Face>> *local_f8;
  _Rb_tree<std::_List_const_iterator<CMU462::Halfedge>,_std::pair<const_std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>_>,_std::_Select1st<std::pair<const_std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>_>_>,_std::less<std::_List_const_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
  local_f0;
  _Rb_tree<std::_List_const_iterator<CMU462::Face>,_std::pair<const_std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>_>,_std::_Select1st<std::pair<const_std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>_>_>,_std::less<std::_List_const_iterator<CMU462::Face>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>_>_>_>
  local_c0;
  _Rb_tree<std::_List_const_iterator<CMU462::Edge>,_std::pair<const_std::_List_const_iterator<CMU462::Edge>,_std::_List_iterator<CMU462::Edge>_>,_std::_Select1st<std::pair<const_std::_List_const_iterator<CMU462::Edge>,_std::_List_iterator<CMU462::Edge>_>_>,_std::less<std::_List_const_iterator<CMU462::Edge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Edge>,_std::_List_iterator<CMU462::Edge>_>_>_>
  local_90;
  _Rb_tree<std::_List_const_iterator<CMU462::Vertex>,_std::pair<const_std::_List_const_iterator<CMU462::Vertex>,_std::_List_iterator<CMU462::Vertex>_>,_std::_Select1st<std::pair<const_std::_List_const_iterator<CMU462::Vertex>,_std::_List_iterator<CMU462::Vertex>_>_>,_std::less<std::_List_const_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Vertex>,_std::_List_iterator<CMU462::Vertex>_>_>_>
  local_60;
  
  std::__cxx11::_List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>::_M_clear
            ((_List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_> *)this);
  (this->halfedges).super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)this;
  (this->halfedges).super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)this;
  (this->halfedges).super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>._M_impl.
  _M_node._M_size = 0;
  this_00 = &this->vertices;
  std::__cxx11::_List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>::_M_clear
            (&this_00->super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>);
  (this->vertices).super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>._M_impl._M_node
  .super__List_node_base._M_prev = (_List_node_base *)this_00;
  (this->vertices).super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>._M_impl._M_node
  .super__List_node_base._M_next = (_List_node_base *)this_00;
  (this->vertices).super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>._M_impl._M_node
  ._M_size = 0;
  this_01 = &this->edges;
  local_108 = (list<CMU462::Vertex,std::allocator<CMU462::Vertex>> *)this_00;
  std::__cxx11::_List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_>::_M_clear
            (&this_01->super__List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_>);
  (this->edges).super__List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)this_01;
  (this->edges).super__List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)this_01;
  (this->edges).super__List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_>._M_impl._M_node.
  _M_size = 0;
  this_02 = &this->faces;
  local_110 = (list<CMU462::Edge,std::allocator<CMU462::Edge>> *)this_01;
  std::__cxx11::_List_base<CMU462::Face,_std::allocator<CMU462::Face>_>::_M_clear
            (&this_02->super__List_base<CMU462::Face,_std::allocator<CMU462::Face>_>);
  (this->faces).super__List_base<CMU462::Face,_std::allocator<CMU462::Face>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)this_02;
  (this->faces).super__List_base<CMU462::Face,_std::allocator<CMU462::Face>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)this_02;
  (this->faces).super__List_base<CMU462::Face,_std::allocator<CMU462::Face>_>._M_impl._M_node.
  _M_size = 0;
  this_03 = &this->boundaries;
  local_100 = (list<CMU462::Face,std::allocator<CMU462::Face>> *)this_02;
  std::__cxx11::_List_base<CMU462::Face,_std::allocator<CMU462::Face>_>::_M_clear
            (&this_03->super__List_base<CMU462::Face,_std::allocator<CMU462::Face>_>);
  (this->boundaries).super__List_base<CMU462::Face,_std::allocator<CMU462::Face>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)this_03;
  (this->boundaries).super__List_base<CMU462::Face,_std::allocator<CMU462::Face>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)this_03;
  (this->boundaries).super__List_base<CMU462::Face,_std::allocator<CMU462::Face>_>._M_impl._M_node.
  _M_size = 0;
  local_f0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_f0._M_impl.super__Rb_tree_header._M_header;
  local_f0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_f0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_f0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c0._M_impl.super__Rb_tree_header._M_header;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c0._M_impl.super__Rb_tree_header._M_node_count = 0;
  pHVar17 = (HalfedgeMesh *)
            (mesh->halfedges).super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>.
            _M_impl._M_node.super__List_node_base._M_next;
  local_f8 = (list<CMU462::Face,std::allocator<CMU462::Face>> *)this_03;
  local_f0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_f0._M_impl.super__Rb_tree_header._M_header._M_left;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c0._M_impl.super__Rb_tree_header._M_header._M_left;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (pHVar17 != mesh) {
    do {
      local_118._M_node = (_List_node_base *)pHVar17;
      p_Var5 = (_List_node_base *)operator_new(0x40);
      p_Var5[1]._M_next = (_List_node_base *)&PTR_centroid_00266d48;
      p_Var2 = (pHVar17->vertices).super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>
               ._M_impl._M_node.super__List_node_base._M_prev;
      p_Var3 = (_List_node_base *)
               (pHVar17->vertices).super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>
               ._M_impl._M_node._M_size;
      p_Var4 = (pHVar17->edges).super__List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_>.
               _M_impl._M_node.super__List_node_base._M_next;
      p_Var5[1]._M_prev =
           (pHVar17->vertices).super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>.
           _M_impl._M_node.super__List_node_base._M_next;
      p_Var5[2]._M_next = p_Var2;
      p_Var5[2]._M_prev = p_Var3;
      p_Var5[3]._M_next = p_Var4;
      p_Var5[3]._M_prev =
           (pHVar17->edges).super__List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_>._M_impl.
           _M_node.super__List_node_base._M_prev;
      std::__detail::_List_node_base::_M_hook(p_Var5);
      psVar1 = &(this->halfedges).
                super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>._M_impl.
                _M_node._M_size;
      *psVar1 = *psVar1 + 1;
      pmVar6 = std::
               map<std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::_List_const_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
               ::operator[]((map<std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::_List_const_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
                             *)&local_f0,&local_118);
      pmVar6->_M_node = p_Var5;
      pHVar17 = (HalfedgeMesh *)
                (((list<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_> *)
                 &(local_118._M_node)->_M_next)->
                super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>)._M_impl.
                _M_node.super__List_node_base._M_next;
    } while (pHVar17 != mesh);
  }
  plVar13 = local_108;
  plVar14 = local_110;
  for (local_118._M_node =
            (mesh->vertices).super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>.
            _M_impl._M_node.super__List_node_base._M_next; local_110 = plVar14,
      local_118._M_node != (_List_node_base *)&mesh->vertices;
      local_118._M_node = (local_118._M_node)->_M_next) {
    p_Var7 = std::__cxx11::list<CMU462::Vertex,std::allocator<CMU462::Vertex>>::
             _M_create_node<CMU462::Vertex_const&>(plVar13,(Vertex *)(local_118._M_node + 1));
    std::__detail::_List_node_base::_M_hook(&p_Var7->super__List_node_base);
    psVar1 = &(this->vertices).super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>.
              _M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    pmVar8 = std::
             map<std::_List_const_iterator<CMU462::Vertex>,_std::_List_iterator<CMU462::Vertex>,_std::less<std::_List_const_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Vertex>,_std::_List_iterator<CMU462::Vertex>_>_>_>
             ::operator[]((map<std::_List_const_iterator<CMU462::Vertex>,_std::_List_iterator<CMU462::Vertex>,_std::less<std::_List_const_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Vertex>,_std::_List_iterator<CMU462::Vertex>_>_>_>
                           *)&local_60,(key_type *)&local_118);
    pmVar8->_M_node = &p_Var7->super__List_node_base;
    plVar14 = local_110;
  }
  plVar16 = local_100;
  for (local_118._M_node =
            (mesh->edges).super__List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_>._M_impl.
            _M_node.super__List_node_base._M_next; local_100 = plVar16,
      local_118._M_node != (_List_node_base *)&mesh->edges;
      local_118._M_node = (local_118._M_node)->_M_next) {
    p_Var9 = std::__cxx11::list<CMU462::Edge,std::allocator<CMU462::Edge>>::
             _M_create_node<CMU462::Edge_const&>(plVar14,(Edge *)(local_118._M_node + 1));
    std::__detail::_List_node_base::_M_hook(&p_Var9->super__List_node_base);
    psVar1 = &(this->edges).super__List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_>._M_impl.
              _M_node._M_size;
    *psVar1 = *psVar1 + 1;
    pmVar10 = std::
              map<std::_List_const_iterator<CMU462::Edge>,_std::_List_iterator<CMU462::Edge>,_std::less<std::_List_const_iterator<CMU462::Edge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Edge>,_std::_List_iterator<CMU462::Edge>_>_>_>
              ::operator[]((map<std::_List_const_iterator<CMU462::Edge>,_std::_List_iterator<CMU462::Edge>,_std::less<std::_List_const_iterator<CMU462::Edge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Edge>,_std::_List_iterator<CMU462::Edge>_>_>_>
                            *)&local_90,(key_type *)&local_118);
    pmVar10->_M_node = &p_Var9->super__List_node_base;
    plVar16 = local_100;
  }
  this_04 = local_f8;
  for (local_118._M_node =
            (mesh->faces).super__List_base<CMU462::Face,_std::allocator<CMU462::Face>_>._M_impl.
            _M_node.super__List_node_base._M_next; local_f8 = this_04,
      local_118._M_node != (_List_node_base *)&mesh->faces;
      local_118._M_node = (local_118._M_node)->_M_next) {
    p_Var11 = std::__cxx11::list<CMU462::Face,std::allocator<CMU462::Face>>::
              _M_create_node<CMU462::Face_const&>(plVar16,(Face *)(local_118._M_node + 1));
    std::__detail::_List_node_base::_M_hook(&p_Var11->super__List_node_base);
    psVar1 = &(this->faces).super__List_base<CMU462::Face,_std::allocator<CMU462::Face>_>._M_impl.
              _M_node._M_size;
    *psVar1 = *psVar1 + 1;
    pmVar12 = std::
              map<std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>,_std::less<std::_List_const_iterator<CMU462::Face>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>_>_>_>
              ::operator[]((map<std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>,_std::less<std::_List_const_iterator<CMU462::Face>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>_>_>_>
                            *)&local_c0,(key_type *)&local_118);
    pmVar12->_M_node = &p_Var11->super__List_node_base;
    this_04 = local_f8;
  }
  local_118._M_node =
       (mesh->boundaries).super__List_base<CMU462::Face,_std::allocator<CMU462::Face>_>._M_impl.
       _M_node.super__List_node_base._M_next;
  if (local_118._M_node != (_List_node_base *)&mesh->boundaries) {
    do {
      p_Var11 = std::__cxx11::list<CMU462::Face,std::allocator<CMU462::Face>>::
                _M_create_node<CMU462::Face_const&>(this_04,(Face *)(local_118._M_node + 1));
      std::__detail::_List_node_base::_M_hook(&p_Var11->super__List_node_base);
      psVar1 = &(this->boundaries).super__List_base<CMU462::Face,_std::allocator<CMU462::Face>_>.
                _M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      pmVar12 = std::
                map<std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>,_std::less<std::_List_const_iterator<CMU462::Face>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>_>_>_>
                ::operator[]((map<std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>,_std::less<std::_List_const_iterator<CMU462::Face>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>_>_>_>
                              *)&local_c0,(key_type *)&local_118);
      pmVar12->_M_node = &p_Var11->super__List_node_base;
      local_118._M_node = (local_118._M_node)->_M_next;
    } while (local_118._M_node != (_List_node_base *)&mesh->boundaries);
  }
  pHVar17 = (HalfedgeMesh *)
            (this->halfedges).super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>.
            _M_impl._M_node.super__List_node_base._M_next;
  if (pHVar17 != this) {
    do {
      local_118._M_node =
           (pHVar17->vertices).super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>.
           _M_impl._M_node.super__List_node_base._M_prev;
      pmVar6 = std::
               map<std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::_List_const_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
               ::operator[]((map<std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::_List_const_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
                             *)&local_f0,&local_118);
      (pHVar17->vertices).super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>._M_impl.
      _M_node.super__List_node_base._M_prev = pmVar6->_M_node;
      local_118._M_node =
           (pHVar17->vertices).super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>.
           _M_impl._M_node.super__List_node_base._M_next;
      pmVar6 = std::
               map<std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::_List_const_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
               ::operator[]((map<std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::_List_const_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
                             *)&local_f0,&local_118);
      (pHVar17->vertices).super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>._M_impl.
      _M_node.super__List_node_base._M_next = pmVar6->_M_node;
      local_118._M_node =
           (_List_node_base *)
           (pHVar17->vertices).super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>.
           _M_impl._M_node._M_size;
      pmVar8 = std::
               map<std::_List_const_iterator<CMU462::Vertex>,_std::_List_iterator<CMU462::Vertex>,_std::less<std::_List_const_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Vertex>,_std::_List_iterator<CMU462::Vertex>_>_>_>
               ::operator[]((map<std::_List_const_iterator<CMU462::Vertex>,_std::_List_iterator<CMU462::Vertex>,_std::less<std::_List_const_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Vertex>,_std::_List_iterator<CMU462::Vertex>_>_>_>
                             *)&local_60,(key_type *)&local_118);
      (pHVar17->vertices).super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>._M_impl.
      _M_node._M_size = (size_t)pmVar8->_M_node;
      local_118._M_node =
           (pHVar17->edges).super__List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_>._M_impl.
           _M_node.super__List_node_base._M_next;
      pmVar10 = std::
                map<std::_List_const_iterator<CMU462::Edge>,_std::_List_iterator<CMU462::Edge>,_std::less<std::_List_const_iterator<CMU462::Edge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Edge>,_std::_List_iterator<CMU462::Edge>_>_>_>
                ::operator[]((map<std::_List_const_iterator<CMU462::Edge>,_std::_List_iterator<CMU462::Edge>,_std::less<std::_List_const_iterator<CMU462::Edge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Edge>,_std::_List_iterator<CMU462::Edge>_>_>_>
                              *)&local_90,(key_type *)&local_118);
      (pHVar17->edges).super__List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_>._M_impl._M_node
      .super__List_node_base._M_next = pmVar10->_M_node;
      local_118._M_node =
           (pHVar17->edges).super__List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_>._M_impl.
           _M_node.super__List_node_base._M_prev;
      pmVar12 = std::
                map<std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>,_std::less<std::_List_const_iterator<CMU462::Face>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>_>_>_>
                ::operator[]((map<std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>,_std::less<std::_List_const_iterator<CMU462::Face>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>_>_>_>
                              *)&local_c0,(key_type *)&local_118);
      (pHVar17->edges).super__List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_>._M_impl._M_node
      .super__List_node_base._M_prev = pmVar12->_M_node;
      pHVar17 = (HalfedgeMesh *)
                (pHVar17->halfedges).
                super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>._M_impl.
                _M_node.super__List_node_base._M_next;
    } while (pHVar17 != this);
  }
  plVar16 = local_100;
  plVar13 = *(list<CMU462::Vertex,std::allocator<CMU462::Vertex>> **)&local_108->field_0x0;
  if (plVar13 != local_108) {
    do {
      local_118._M_node = *(_List_node_base **)(plVar13 + 0xf8);
      pmVar6 = std::
               map<std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::_List_const_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
               ::operator[]((map<std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::_List_const_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
                             *)&local_f0,&local_118);
      *(_List_node_base **)(plVar13 + 0xf8) = pmVar6->_M_node;
      plVar13 = *(list<CMU462::Vertex,std::allocator<CMU462::Vertex>> **)&plVar13->field_0x0;
    } while (plVar13 != local_108);
  }
  plVar14 = *(list<CMU462::Edge,std::allocator<CMU462::Edge>> **)&local_110->field_0x0;
  if (plVar14 != local_110) {
    do {
      local_118._M_node = *(_List_node_base **)(plVar14 + 0x68);
      pmVar6 = std::
               map<std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::_List_const_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
               ::operator[]((map<std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::_List_const_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
                             *)&local_f0,&local_118);
      *(_List_node_base **)(plVar14 + 0x68) = pmVar6->_M_node;
      plVar14 = *(list<CMU462::Edge,std::allocator<CMU462::Edge>> **)&plVar14->field_0x0;
    } while (plVar14 != local_110);
  }
  plVar15 = *(list<CMU462::Face,std::allocator<CMU462::Face>> **)&plVar16->field_0x0;
  if (plVar15 != plVar16) {
    do {
      local_118._M_node = *(_List_node_base **)(plVar15 + 0xb8);
      pmVar6 = std::
               map<std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::_List_const_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
               ::operator[]((map<std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::_List_const_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
                             *)&local_f0,&local_118);
      *(_List_node_base **)(plVar15 + 0xb8) = pmVar6->_M_node;
      plVar15 = *(list<CMU462::Face,std::allocator<CMU462::Face>> **)&plVar15->field_0x0;
    } while (plVar15 != plVar16);
  }
  plVar16 = *(list<CMU462::Face,std::allocator<CMU462::Face>> **)&this_04->field_0x0;
  if (plVar16 != this_04) {
    do {
      local_118._M_node = *(_List_node_base **)(plVar16 + 0xb8);
      pmVar6 = std::
               map<std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::_List_const_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
               ::operator[]((map<std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::_List_const_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
                             *)&local_f0,&local_118);
      *(_List_node_base **)(plVar16 + 0xb8) = pmVar6->_M_node;
      plVar16 = *(list<CMU462::Face,std::allocator<CMU462::Face>> **)&plVar16->field_0x0;
    } while (plVar16 != this_04);
  }
  std::
  _Rb_tree<std::_List_const_iterator<CMU462::Face>,_std::pair<const_std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>_>,_std::_Select1st<std::pair<const_std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>_>_>,_std::less<std::_List_const_iterator<CMU462::Face>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>_>_>_>
  ::~_Rb_tree(&local_c0);
  std::
  _Rb_tree<std::_List_const_iterator<CMU462::Edge>,_std::pair<const_std::_List_const_iterator<CMU462::Edge>,_std::_List_iterator<CMU462::Edge>_>,_std::_Select1st<std::pair<const_std::_List_const_iterator<CMU462::Edge>,_std::_List_iterator<CMU462::Edge>_>_>,_std::less<std::_List_const_iterator<CMU462::Edge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Edge>,_std::_List_iterator<CMU462::Edge>_>_>_>
  ::~_Rb_tree(&local_90);
  std::
  _Rb_tree<std::_List_const_iterator<CMU462::Vertex>,_std::pair<const_std::_List_const_iterator<CMU462::Vertex>,_std::_List_iterator<CMU462::Vertex>_>,_std::_Select1st<std::pair<const_std::_List_const_iterator<CMU462::Vertex>,_std::_List_iterator<CMU462::Vertex>_>_>,_std::less<std::_List_const_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Vertex>,_std::_List_iterator<CMU462::Vertex>_>_>_>
  ::~_Rb_tree(&local_60);
  std::
  _Rb_tree<std::_List_const_iterator<CMU462::Halfedge>,_std::pair<const_std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>_>,_std::_Select1st<std::pair<const_std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>_>_>,_std::less<std::_List_const_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
  ::~_Rb_tree(&local_f0);
  return this;
}

Assistant:

const HalfedgeMesh& HalfedgeMesh::operator=(const HalfedgeMesh& mesh)
    // The assignment operator does a "deep" copy of the halfedge mesh data
    // structure; in other words, it makes new instances of each mesh element, and
    // ensures that pointers in the copy point to the newly allocated elements
    // rather than elements in the original mesh.  This behavior is especially
    // important for making assignments, since the mesh on the right-hand side of an
    // assignment may be temporary (hence any pointers to elements in this mesh will
    // become invalid as soon as it is released.)
  {
    // Clear any existing elements.
    halfedges.clear();
    vertices.clear();
    edges.clear();
    faces.clear();
    boundaries.clear();

    // These maps will be used to identify elements of the old mesh
    // with elements of the new mesh.  (Note that we can use a single
    // map for both interior and boundary faces, because the map
    // doesn't care which list of faces these iterators come from.)
    map<HalfedgeCIter, HalfedgeIter> halfedgeOldToNew;
    map<VertexCIter, VertexIter> vertexOldToNew;
    map<EdgeCIter, EdgeIter> edgeOldToNew;
    map<FaceCIter, FaceIter> faceOldToNew;

    // Copy geometry from the original mesh and create a map from
    // pointers in the original mesh to those in the new mesh.
    for (HalfedgeCIter h = mesh.halfedgesBegin(); h != mesh.halfedgesEnd(); h++)
      halfedgeOldToNew[h] = halfedges.insert(halfedges.end(), *h);
    for (VertexCIter v = mesh.verticesBegin(); v != mesh.verticesEnd(); v++)
      vertexOldToNew[v] = vertices.insert(vertices.end(), *v);
    for (EdgeCIter e = mesh.edgesBegin(); e != mesh.edgesEnd(); e++)
      edgeOldToNew[e] = edges.insert(edges.end(), *e);
    for (FaceCIter f = mesh.facesBegin(); f != mesh.facesEnd(); f++)
      faceOldToNew[f] = faces.insert(faces.end(), *f);
    for (FaceCIter b = mesh.boundariesBegin(); b != mesh.boundariesEnd(); b++)
      faceOldToNew[b] = boundaries.insert(boundaries.end(), *b);

    // "Search and replace" old pointers with new ones.
    for (HalfedgeIter he = halfedgesBegin(); he != halfedgesEnd(); he++) {
      he->next() = halfedgeOldToNew[he->next()];
      he->twin() = halfedgeOldToNew[he->twin()];
      he->vertex() = vertexOldToNew[he->vertex()];
      he->edge() = edgeOldToNew[he->edge()];
      he->face() = faceOldToNew[he->face()];
    }
    for (VertexIter v = verticesBegin(); v != verticesEnd(); v++)
      v->halfedge() = halfedgeOldToNew[v->halfedge()];
    for (EdgeIter e = edgesBegin(); e != edgesEnd(); e++)
      e->halfedge() = halfedgeOldToNew[e->halfedge()];
    for (FaceIter f = facesBegin(); f != facesEnd(); f++)
      f->halfedge() = halfedgeOldToNew[f->halfedge()];
    for (FaceIter b = boundariesBegin(); b != boundariesEnd(); b++)
      b->halfedge() = halfedgeOldToNew[b->halfedge()];

    // Return a reference to the new mesh.
    return *this;
  }